

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList(ON_ClippingPlaneDataList *this)

{
  ON_ClippingPlaneData *this_00;
  ON_ClippingPlaneData **ppOVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < (this->m_list).m_count; lVar2 = lVar2 + 1) {
    ppOVar1 = (this->m_list).m_a;
    this_00 = ppOVar1[lVar2];
    if (this_00 != (ON_ClippingPlaneData *)0x0) {
      ON_ClippingPlaneData::~ON_ClippingPlaneData(this_00);
      operator_delete(this_00,0x50);
      ppOVar1 = (this->m_list).m_a;
    }
    ppOVar1[lVar2] = (ON_ClippingPlaneData *)0x0;
  }
  ON_SimpleArray<ON_ClippingPlaneData_*>::~ON_SimpleArray(&this->m_list);
  return;
}

Assistant:

ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList()
{
  for(int i=0; i<m_list.Count(); i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data)
      delete data;
    m_list[i] = nullptr;
  }
}